

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formats.h
# Opt level: O0

khr_df_model_e ktx::getColorModelForBlockCompressedFormat(VkFormat format)

{
  int in_EDI;
  khr_df_model_e local_4;
  
  if ((((in_EDI == 0x83) || (in_EDI == 0x84)) || (in_EDI == 0x85)) || (in_EDI == 0x86)) {
    return KHR_DF_MODEL_BC1A;
  }
  if ((in_EDI == 0x87) || (in_EDI == 0x88)) {
    return KHR_DF_MODEL_BC2;
  }
  if ((in_EDI == 0x89) || (in_EDI == 0x8a)) {
    return KHR_DF_MODEL_BC3;
  }
  if ((in_EDI == 0x8b) || (in_EDI == 0x8c)) {
    return KHR_DF_MODEL_ATI1N;
  }
  if ((in_EDI == 0x8d) || (in_EDI == 0x8e)) {
    return KHR_DF_MODEL_ATI2N_XY;
  }
  if ((in_EDI == 0x8f) || (in_EDI == 0x90)) {
    return KHR_DF_MODEL_BC6H;
  }
  if ((in_EDI == 0x91) || (in_EDI == 0x92)) {
    return KHR_DF_MODEL_BC7;
  }
  if ((((((in_EDI == 0x93) || (in_EDI == 0x94)) || (in_EDI == 0x95)) ||
       (((in_EDI == 0x96 || (in_EDI == 0x97)) ||
        ((in_EDI == 0x98 || ((in_EDI == 0x99 || (in_EDI == 0x9a)))))))) || (in_EDI == 0x9b)) ||
     (in_EDI == 0x9c)) {
    return KHR_DF_MODEL_ETC2;
  }
  if (((((in_EDI == 0x9d) || (in_EDI == 0x9e)) || (in_EDI == 0x9f)) ||
      (((in_EDI == 0xa0 || (in_EDI == 0xa1)) ||
       ((in_EDI == 0xa2 || ((in_EDI == 0xa3 || (in_EDI == 0xa4)))))))) ||
     (((in_EDI == 0xa5 ||
       ((((((in_EDI == 0xa6 || (in_EDI == 0xa7)) || (in_EDI == 0xa8)) ||
          ((in_EDI == 0xa9 || (in_EDI == 0xaa)))) || (in_EDI == 0xab)) ||
        (((in_EDI == 0xac || (in_EDI == 0xad)) ||
         ((in_EDI == 0xae || (((in_EDI == 0xaf || (in_EDI == 0xb0)) || (in_EDI == 0xb1)))))))))) ||
      (((in_EDI == 0xb2 || (in_EDI == 0xb3)) ||
       ((in_EDI == 0xb4 ||
        (((in_EDI == 0xb5 || (in_EDI == 0xb6)) || ((in_EDI == 0xb7 || (in_EDI == 0xb8)))))))))))) {
    return KHR_DF_MODEL_ASTC;
  }
  if ((in_EDI == 0x3b9b9cf0) || (in_EDI == 0x3b9b9cf1)) {
LAB_002c8d23:
    local_4 = KHR_DF_MODEL_PVRTC;
  }
  else {
    if ((in_EDI != 0x3b9b9cf2) && (in_EDI != 0x3b9b9cf3)) {
      if ((in_EDI == 0x3b9b9cf4) || (in_EDI == 0x3b9b9cf5)) goto LAB_002c8d23;
      if ((in_EDI != 0x3b9b9cf6) && (in_EDI != 0x3b9b9cf7)) {
        if (in_EDI == 0x3b9bcbd0) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9bcbd1) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9bcbd2) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9bcbd3) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9bcbd4) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9bcbd5) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9bcbd6) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9bcbd7) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9bcbd8) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9bcbd9) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9bcbda) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9bcbdb) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9bcbdc) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9bcbdd) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f00) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f01) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f02) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f03) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f04) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f05) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f06) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f07) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f08) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f09) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f0a) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f0b) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f0c) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f0d) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f0e) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f0f) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f10) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f11) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f12) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f13) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f14) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f15) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f16) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f17) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f18) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f19) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f1a) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f1b) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f1c) {
          return KHR_DF_MODEL_ASTC;
        }
        if (in_EDI == 0x3b9f2f1d) {
          return KHR_DF_MODEL_ASTC;
        }
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/formats.h"
                      ,0x104,"khr_df_model_e ktx::getColorModelForBlockCompressedFormat(VkFormat)");
      }
    }
    local_4 = KHR_DF_MODEL_PVRTC2;
  }
  return local_4;
}

Assistant:

[[nodiscard]] inline khr_df_model_e getColorModelForBlockCompressedFormat(VkFormat format) noexcept {
    switch (format) {
    case VK_FORMAT_BC1_RGB_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_BC1_RGB_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_BC1_RGBA_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_BC1_RGBA_SRGB_BLOCK:
        return KHR_DF_MODEL_BC1A;
    case VK_FORMAT_BC2_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_BC2_SRGB_BLOCK:
        return KHR_DF_MODEL_BC2;
    case VK_FORMAT_BC3_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_BC3_SRGB_BLOCK:
        return KHR_DF_MODEL_BC3;
    case VK_FORMAT_BC4_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_BC4_SNORM_BLOCK:
        return KHR_DF_MODEL_BC4;
    case VK_FORMAT_BC5_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_BC5_SNORM_BLOCK:
        return KHR_DF_MODEL_BC5;
    case VK_FORMAT_BC6H_UFLOAT_BLOCK: [[fallthrough]];
    case VK_FORMAT_BC6H_SFLOAT_BLOCK:
        return KHR_DF_MODEL_BC6H;
    case VK_FORMAT_BC7_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_BC7_SRGB_BLOCK:
        return KHR_DF_MODEL_BC7;
    case VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_EAC_R11_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_EAC_R11_SNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_EAC_R11G11_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_EAC_R11G11_SNORM_BLOCK:
        return KHR_DF_MODEL_ETC2;
    case VK_FORMAT_ASTC_4x4_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_4x4_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_5x4_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_5x4_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_5x5_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_5x5_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_6x5_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_6x5_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_6x6_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_6x6_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x5_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x5_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x6_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x6_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x8_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x8_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x5_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x5_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x6_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x6_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x8_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x8_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x10_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x10_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_12x10_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_12x10_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_12x12_UNORM_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_12x12_SRGB_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_4x4_SFLOAT_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_5x4_SFLOAT_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_5x5_SFLOAT_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_6x5_SFLOAT_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_6x6_SFLOAT_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x5_SFLOAT_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x6_SFLOAT_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_8x8_SFLOAT_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x5_SFLOAT_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x6_SFLOAT_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x8_SFLOAT_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_10x10_SFLOAT_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_12x10_SFLOAT_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_12x12_SFLOAT_BLOCK: [[fallthrough]];
    case VK_FORMAT_ASTC_3x3x3_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_3x3x3_SRGB_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_3x3x3_SFLOAT_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_4x3x3_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_4x3x3_SRGB_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_4x3x3_SFLOAT_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_4x4x3_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_4x4x3_SRGB_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_4x4x3_SFLOAT_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_4x4x4_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_4x4x4_SRGB_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_4x4x4_SFLOAT_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_5x4x4_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_5x4x4_SRGB_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_5x4x4_SFLOAT_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_5x5x4_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_5x5x4_SRGB_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_5x5x4_SFLOAT_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_5x5x5_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_5x5x5_SRGB_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_5x5x5_SFLOAT_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_6x5x5_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_6x5x5_SRGB_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_6x5x5_SFLOAT_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_6x6x5_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_6x6x5_SRGB_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_6x6x5_SFLOAT_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_6x6x6_UNORM_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_6x6x6_SRGB_BLOCK_EXT: [[fallthrough]];
    case VK_FORMAT_ASTC_6x6x6_SFLOAT_BLOCK_EXT:
        return KHR_DF_MODEL_ASTC;
    case VK_FORMAT_PVRTC1_2BPP_UNORM_BLOCK_IMG: [[fallthrough]];
    case VK_FORMAT_PVRTC1_4BPP_UNORM_BLOCK_IMG: [[fallthrough]];
    case VK_FORMAT_PVRTC1_2BPP_SRGB_BLOCK_IMG: [[fallthrough]];
    case VK_FORMAT_PVRTC1_4BPP_SRGB_BLOCK_IMG:
        return KHR_DF_MODEL_PVRTC;
    case VK_FORMAT_PVRTC2_2BPP_UNORM_BLOCK_IMG: [[fallthrough]];
    case VK_FORMAT_PVRTC2_4BPP_UNORM_BLOCK_IMG: [[fallthrough]];
    case VK_FORMAT_PVRTC2_2BPP_SRGB_BLOCK_IMG: [[fallthrough]];
    case VK_FORMAT_PVRTC2_4BPP_SRGB_BLOCK_IMG:
        return KHR_DF_MODEL_PVRTC2;
    default:
        assert(false);
        return KHR_DF_MODEL_UNSPECIFIED;
    }
}